

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

void __thiscall opts::BasicOption::output(BasicOption *this,ostream *out,int max_long)

{
  ostream *poVar1;
  ulong uVar2;
  int in_EDX;
  ostream *in_RSI;
  BasicOption *in_RDI;
  int i;
  int local_18;
  
  std::operator<<(in_RSI,"   ");
  if (in_RDI->s == '\0') {
    std::operator<<(in_RSI,"    ");
  }
  else {
    poVar1 = std::operator<<(in_RSI,'-');
    poVar1 = std::operator<<(poVar1,in_RDI->s);
    std::operator<<(poVar1,", ");
  }
  poVar1 = std::operator<<(in_RSI,"--");
  poVar1 = std::operator<<(poVar1,(string *)&in_RDI->l);
  std::operator<<(poVar1,' ');
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator<<(in_RSI,(string *)&in_RDI->t);
  }
  for (local_18 = long_size(in_RDI); local_18 < in_EDX; local_18 = local_18 + 1) {
    std::operator<<(in_RSI,' ');
  }
  poVar1 = std::operator<<(in_RSI,"   ");
  std::operator<<(poVar1,(string *)&in_RDI->help);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = std::operator<<(in_RSI," [default: ");
    poVar1 = std::operator<<(poVar1,(string *)&in_RDI->d);
    std::operator<<(poVar1,"]");
  }
  std::operator<<(in_RSI,'\n');
  return;
}

Assistant:

void            output(std::ostream& out, int max_long) const
    {
        out << "   ";
        if (s)
            out << '-' << s << ", ";
        else
            out << "    ";

        out << "--" << l << ' ';

        if (!t.empty())
            out << t;

        for (int i = long_size(); i < max_long; ++i)
            out <<  ' ';

        out << "   " << help;

        if (!d.empty())
        {
            out << " [default: " << d << "]";
        }
        out << '\n';
    }